

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp_mkdir.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  in_addr_t iVar2;
  uint uVar3;
  int __fd;
  int iVar4;
  long lVar5;
  long lVar6;
  size_t sVar7;
  size_t sVar8;
  char *pcVar9;
  long lVar10;
  size_t sStack_50;
  sockaddr_in sin;
  
  iVar2 = 0x100007f;
  if ((1 < argc) && (iVar2 = inet_addr(argv[1]), argc != 2)) {
    username = argv[2];
    if ((3 < (uint)argc) && (password = argv[3], argc != 4)) {
      sftppath = argv[4];
    }
  }
  uVar3 = libssh2_init(0);
  if (uVar3 != 0) {
    fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)uVar3);
    return 1;
  }
  __fd = socket(2,1,0);
  if (__fd == -1) {
    fwrite("failed to create socket.\n",0x19,1,_stderr);
    goto LAB_00101519;
  }
  sin.sin_family = 2;
  sin.sin_port = 0x1600;
  sin.sin_addr.s_addr = iVar2;
  iVar4 = connect(__fd,(sockaddr *)&sin,0x10);
  if (iVar4 == 0) {
    lVar5 = libssh2_session_init_ex(0,0,0,0);
    if (lVar5 == 0) {
      pcVar9 = "Could not initialize SSH session.\n";
      sStack_50 = 0x22;
      goto LAB_0010138c;
    }
    uVar3 = libssh2_session_handshake(lVar5,__fd);
    if (uVar3 == 0) {
      lVar6 = libssh2_hostkey_hash(lVar5,2);
      fwrite("Fingerprint: ",0xd,1,_stderr);
      for (lVar10 = 0; lVar10 != 0x14; lVar10 = lVar10 + 1) {
        fprintf(_stderr,"%02X ",(ulong)*(byte *)(lVar6 + lVar10));
      }
      fputc(10,_stderr);
      pcVar9 = username;
      sVar7 = strlen(username);
      pcVar1 = password;
      sVar8 = strlen(password);
      iVar4 = libssh2_userauth_password_ex
                        (lVar5,pcVar9,sVar7 & 0xffffffff,pcVar1,sVar8 & 0xffffffff,0);
      if (iVar4 == 0) {
        lVar6 = libssh2_sftp_init(lVar5);
        if (lVar6 != 0) {
          libssh2_session_set_blocking(lVar5,1);
          pcVar9 = sftppath;
          sVar7 = strlen(sftppath);
          uVar3 = libssh2_sftp_mkdir_ex(lVar6,pcVar9,sVar7 & 0xffffffff,0x1ed);
          if (uVar3 != 0) {
            fprintf(_stderr,"libssh2_sftp_mkdir failed: %d\n",(ulong)uVar3);
          }
          libssh2_sftp_shutdown(lVar6);
          goto LAB_001014e7;
        }
        pcVar9 = "Unable to init SFTP session\n";
        sStack_50 = 0x1c;
      }
      else {
        pcVar9 = "Authentication by password failed.\n";
        sStack_50 = 0x23;
      }
      fwrite(pcVar9,sStack_50,1,_stderr);
    }
    else {
      fprintf(_stderr,"Failure establishing SSH session: %d\n",(ulong)uVar3);
    }
LAB_001014e7:
    libssh2_session_disconnect_ex(lVar5,0xb,"Normal Shutdown","");
    libssh2_session_free(lVar5);
  }
  else {
    pcVar9 = "failed to connect.\n";
    sStack_50 = 0x13;
LAB_0010138c:
    fwrite(pcVar9,sStack_50,1,_stderr);
  }
  shutdown(__fd,2);
  close(__fd);
LAB_00101519:
  fwrite("all done\n",9,1,_stderr);
  libssh2_exit();
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    uint32_t hostaddr;
    libssh2_socket_t sock;
    int i, auth_pw = 1;
    struct sockaddr_in sin;
    const char *fingerprint;
    int rc;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_SFTP *sftp_session;

#ifdef _WIN32
    WSADATA wsadata;

    rc = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(rc) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", rc);
        return 1;
    }
#endif

    if(argc > 1) {
        hostaddr = inet_addr(argv[1]);
    }
    else {
        hostaddr = htonl(0x7F000001);
    }
    if(argc > 2) {
        username = argv[2];
    }
    if(argc > 3) {
        password = argv[3];
    }
    if(argc > 4) {
        sftppath = argv[4];
    }

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    /*
     * The application code is responsible for creating the socket
     * and establishing the connection
     */
    sock = socket(AF_INET, SOCK_STREAM, 0);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to create socket.\n");
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_port = htons(22);
    sin.sin_addr.s_addr = hostaddr;
    if(connect(sock, (struct sockaddr*)(&sin), sizeof(struct sockaddr_in))) {
        fprintf(stderr, "failed to connect.\n");
        goto shutdown;
    }

    /* Create a session instance */
    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "Could not initialize SSH session.\n");
        goto shutdown;
    }

    /* ... start it up. This will trade welcome banners, exchange keys,
     * and setup crypto, compression, and MAC layers
     */
    rc = libssh2_session_handshake(session, sock);
    if(rc) {
        fprintf(stderr, "Failure establishing SSH session: %d\n", rc);
        goto shutdown;
    }

    /* At this point we have not yet authenticated.  The first thing to do
     * is check the hostkey's fingerprint against our known hosts Your app
     * may have it hard coded, may go to a file, may present it to the
     * user, that's your call
     */
    fingerprint = libssh2_hostkey_hash(session, LIBSSH2_HOSTKEY_HASH_SHA1);
    fprintf(stderr, "Fingerprint: ");
    for(i = 0; i < 20; i++) {
        fprintf(stderr, "%02X ", (unsigned char)fingerprint[i]);
    }
    fprintf(stderr, "\n");

    if(auth_pw) {
        /* We could authenticate via password */
        if(libssh2_userauth_password(session, username, password)) {
            fprintf(stderr, "Authentication by password failed.\n");
            goto shutdown;
        }
    }
    else {
        /* Or by public key */
        if(libssh2_userauth_publickey_fromfile(session, username,
                                               pubkey, privkey,
                                               password)) {
            fprintf(stderr, "Authentication by public key failed.\n");
            goto shutdown;
        }
    }

    sftp_session = libssh2_sftp_init(session);

    if(!sftp_session) {
        fprintf(stderr, "Unable to init SFTP session\n");
        goto shutdown;
    }

    /* Since we have not set non-blocking, tell libssh2 we are blocking */
    libssh2_session_set_blocking(session, 1);

    /* Make a directory via SFTP */
    rc = libssh2_sftp_mkdir(sftp_session, sftppath,
                            LIBSSH2_SFTP_S_IRWXU |
                            LIBSSH2_SFTP_S_IRGRP |
                            LIBSSH2_SFTP_S_IXGRP |
                            LIBSSH2_SFTP_S_IROTH |
                            LIBSSH2_SFTP_S_IXOTH);
    if(rc)
        fprintf(stderr, "libssh2_sftp_mkdir failed: %d\n", rc);

    libssh2_sftp_shutdown(sftp_session);

shutdown:

    if(session) {
        libssh2_session_disconnect(session, "Normal Shutdown");
        libssh2_session_free(session);
    }

    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2);
        LIBSSH2_SOCKET_CLOSE(sock);
    }

    fprintf(stderr, "all done\n");

    libssh2_exit();

#ifdef _WIN32
    WSACleanup();
#endif

    return 0;
}